

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glfwinfo.c
# Opt level: O2

int main(int argc,char **argv)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  undefined7 uVar13;
  char *pcVar9;
  GLFWwindow *handle;
  undefined8 uVar10;
  GLFWglproc p_Var11;
  byte *pbVar12;
  char *pcVar14;
  char *pcVar15;
  GLint flags;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int major;
  undefined4 local_44;
  int local_40;
  int local_3c;
  undefined4 local_38;
  GLint mask;
  
  local_3c = 0;
  local_40 = 1;
  local_4c = 0;
  local_38 = 0;
  local_44 = 0;
  local_50 = 0;
  local_54 = 0;
  local_58 = 0;
  bVar3 = false;
switchD_00106cc5_caseD_64:
  bVar2 = bVar3;
  iVar4 = getopt(argc,argv,"a:b:dfhlm:n:p:s:");
  pcVar9 = optarg;
  uVar13 = (undefined7)
           ((ulong)((long)&switchD_00106cc5::switchdataD_00110004 +
                   (long)(int)(&switchD_00106cc5::switchdataD_00110004)[iVar4 - 0x61]) >> 8);
  bVar3 = true;
  switch(iVar4) {
  case 0x61:
    iVar4 = strcasecmp(optarg,"gl");
    local_58 = 0x30001;
    bVar3 = bVar2;
    if (iVar4 != 0) {
      iVar4 = strcasecmp(pcVar9,"es");
      local_58 = 0x30002;
      break;
    }
    goto switchD_00106cc5_caseD_64;
  case 0x62:
    iVar4 = strcasecmp(optarg,"none");
    local_4c = 0x35002;
    bVar3 = bVar2;
    if (iVar4 == 0) goto switchD_00106cc5_caseD_64;
    iVar4 = strcasecmp(pcVar9,"flush");
    local_4c = 0x35001;
    break;
  case 99:
  case 0x65:
  case 0x67:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6f:
  case 0x71:
  case 0x72:
    goto switchD_00106cc5_caseD_63;
  case 100:
    goto switchD_00106cc5_caseD_64;
  case 0x66:
    local_38 = (undefined4)CONCAT71(uVar13,1);
    bVar3 = bVar2;
    goto switchD_00106cc5_caseD_64;
  case 0x68:
    usage();
    goto LAB_0010705b;
  case 0x6c:
    local_44 = (undefined4)CONCAT71(uVar13,1);
    bVar3 = bVar2;
    goto switchD_00106cc5_caseD_64;
  case 0x6d:
    local_40 = atoi(optarg);
    bVar3 = bVar2;
    goto switchD_00106cc5_caseD_64;
  case 0x6e:
    local_3c = atoi(optarg);
    bVar3 = bVar2;
    goto switchD_00106cc5_caseD_64;
  case 0x70:
    iVar4 = strcasecmp(optarg,"core");
    local_54 = 0x32001;
    bVar3 = bVar2;
    if (iVar4 == 0) goto switchD_00106cc5_caseD_64;
    iVar4 = strcasecmp(pcVar9,"compat");
    local_54 = 0x32002;
    break;
  case 0x73:
    goto switchD_00106cc5_caseD_73;
  default:
    if (iVar4 == -1) {
      glfwGetVersion(&major,&flags,&mask);
      printf("GLFW header version: %u.%u.%u\n",3,1);
      printf("GLFW library version: %u.%u.%u\n",(ulong)(uint)major,(ulong)(uint)flags);
      if (major != 3) {
        puts("*** ERROR: GLFW major version mismatch! ***");
        goto LAB_0010704e;
      }
      if ((flags != 1) || (mask != 1)) {
        puts("*** WARNING: GLFW version mismatch! ***");
      }
      pcVar9 = glfwGetVersionString();
      printf("GLFW library version string: \"%s\"\n",pcVar9);
      glfwSetErrorCallback(error_callback);
      iVar5 = glfwInit();
      iVar4 = local_3c;
      if (iVar5 == 0) goto LAB_0010704e;
      if (local_40 != 1 || local_3c != 0) {
        glfwWindowHint(0x22002,local_40);
        glfwWindowHint(0x22003,iVar4);
      }
      if (local_58 != 0) {
        glfwWindowHint(0x22001,local_58);
      }
      if (bVar2) {
        glfwWindowHint(0x22007,1);
      }
      if ((char)local_38 != '\0') {
        glfwWindowHint(0x22006,1);
      }
      if (local_54 != 0) {
        glfwWindowHint(0x22008,local_54);
      }
      if (local_50 != 0) {
        glfwWindowHint(0x22005,local_50);
      }
      if (local_4c != 0) {
        glfwWindowHint(0x22009,local_4c);
      }
      glfwWindowHint(0x21001,-1);
      glfwWindowHint(0x21002,-1);
      glfwWindowHint(0x21003,-1);
      glfwWindowHint(0x21004,-1);
      glfwWindowHint(0x21005,-1);
      glfwWindowHint(0x21006,-1);
      glfwWindowHint(0x21007,-1);
      glfwWindowHint(0x21008,-1);
      glfwWindowHint(0x21009,-1);
      glfwWindowHint(0x2100a,-1);
      glfwWindowHint(0x2100b,-1);
      glfwWindowHint(0x2100d,-1);
      glfwWindowHint(0x2100e,-1);
      glfwWindowHint(0x20004,0);
      handle = glfwCreateWindow(200,200,"Version",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
      if (handle != (GLFWwindow *)0x0) {
        glfwMakeContextCurrent(handle);
        iVar4 = glfwGetWindowAttrib(handle,0x22001);
        uVar6 = glfwGetWindowAttrib(handle,0x22002);
        uVar7 = glfwGetWindowAttrib(handle,0x22003);
        uVar8 = glfwGetWindowAttrib(handle,0x22004);
        pcVar9 = "Unknown API";
        if (iVar4 == 0x30002) {
          pcVar9 = "OpenGL ES";
        }
        pcVar14 = "OpenGL";
        if (iVar4 != 0x30001) {
          pcVar14 = pcVar9;
        }
        uVar10 = glGetString(0x1f02);
        printf("%s context version string: \"%s\"\n",pcVar14,uVar10);
        printf("%s context version parsed by GLFW: %u.%u.%u\n",pcVar14,(ulong)uVar6,(ulong)uVar7,
               (ulong)uVar8);
        if (iVar4 == 0x30001) {
          if (2 < (int)uVar6) {
            glGetIntegerv(0x821e,&flags);
            printf("%s context flags (0x%08x):","OpenGL",(ulong)(uint)flags);
            if ((flags & 1U) != 0) {
              printf(" forward-compatible");
            }
            if ((flags & 2U) != 0) {
              printf(" debug");
            }
            if ((flags & 4U) != 0) {
              printf(" robustness");
            }
            putchar(10);
            printf("%s context flags parsed by GLFW:","OpenGL");
            iVar5 = glfwGetWindowAttrib(handle,0x22006);
            if (iVar5 != 0) {
              printf(" forward-compatible");
            }
            iVar5 = glfwGetWindowAttrib(handle,0x22007);
            if (iVar5 != 0) {
              printf(" debug");
            }
            iVar5 = glfwGetWindowAttrib(handle,0x22005);
            if (iVar5 != 0) {
              printf(" robustness");
            }
            putchar(10);
            if (1 < (int)uVar7 || uVar6 != 3) {
              iVar5 = glfwGetWindowAttrib(handle,0x22008);
              glGetIntegerv(0x9126,&mask);
              pcVar15 = "unknown";
              pcVar9 = "core";
              if ((mask & 1U) == 0) {
                pcVar9 = "unknown";
              }
              if ((mask & 2U) != 0) {
                pcVar9 = "compat";
              }
              printf("%s profile mask (0x%08x): %s\n","OpenGL",(ulong)(uint)mask,pcVar9);
              if (iVar5 == 0x32001) {
                pcVar15 = "core";
              }
              if (iVar5 == 0x32002) {
                pcVar15 = "compat";
              }
              printf("%s profile mask parsed by GLFW: %s\n","OpenGL",pcVar15);
            }
          }
          iVar5 = glfwExtensionSupported("GL_ARB_robustness");
          if (iVar5 != 0) {
            glGetIntegerv(0x8256,&major);
            pcVar15 = "unknown";
            pcVar9 = "unknown";
            if (major == 0x8261) {
              pcVar9 = "none";
            }
            if (major == 0x8252) {
              pcVar9 = "lose";
            }
            printf("%s robustness strategy (0x%08x): %s\n","OpenGL",(ulong)(uint)major,pcVar9);
            iVar5 = glfwGetWindowAttrib(handle,0x22005);
            if (iVar5 == 0x31001) {
              pcVar15 = "none";
            }
            if (iVar5 == 0x31002) {
              pcVar15 = "lose";
            }
            printf("%s robustness strategy parsed by GLFW: %s\n","OpenGL",pcVar15);
          }
        }
        uVar10 = glGetString(0x1f01);
        printf("%s context renderer string: \"%s\"\n",pcVar14,uVar10);
        uVar10 = glGetString(0x1f00);
        printf("%s context vendor string: \"%s\"\n",pcVar14,uVar10);
        if (1 < (int)uVar6) {
          uVar10 = glGetString(0x8b8c);
          printf("%s context shading language version: \"%s\"\n",pcVar14,uVar10);
        }
        if ((char)local_44 == '\0') goto LAB_00107483;
        printf("%s context supported extensions:\n",pcVar14);
        if (2 < (int)uVar6 && iVar4 == 0x30001) {
          p_Var11 = glfwGetProcAddress("glGetStringi");
          if (p_Var11 == (GLFWglproc)0x0) goto LAB_00107042;
          glGetIntegerv(0x821d,&major);
          for (uVar6 = 0; (int)uVar6 < major; uVar6 = uVar6 + 1) {
            pcVar9 = (char *)(*p_Var11)(0x1f03,(ulong)uVar6);
            puts(pcVar9);
          }
          goto LAB_0010747b;
        }
        pbVar12 = (byte *)glGetString(0x1f03);
        do {
          bVar1 = *pbVar12;
          uVar6 = 10;
          if (bVar1 != 0x20) {
            if (bVar1 == 0) {
LAB_0010747b:
              putchar(10);
LAB_00107483:
              glfwTerminate();
LAB_0010705b:
              exit(0);
            }
            uVar6 = (uint)bVar1;
          }
          putchar(uVar6);
          pbVar12 = pbVar12 + 1;
        } while( true );
      }
LAB_00107042:
      glfwTerminate();
      goto LAB_0010704e;
    }
    goto switchD_00106cc5_caseD_63;
  }
LAB_00106e2a:
  bVar3 = bVar2;
  if (iVar4 != 0) {
switchD_00106cc5_caseD_63:
    usage();
LAB_0010704e:
    exit(1);
  }
  goto switchD_00106cc5_caseD_64;
switchD_00106cc5_caseD_73:
  iVar4 = strcasecmp(optarg,"none");
  local_50 = 0x31001;
  bVar3 = bVar2;
  if (iVar4 == 0) goto switchD_00106cc5_caseD_64;
  iVar4 = strcasecmp(pcVar9,"lose");
  local_50 = 0x31002;
  goto LAB_00106e2a;
}

Assistant:

int main(int argc, char** argv)
{
    int ch, api = 0, profile = 0, strategy = 0, behavior = 0, major = 1, minor = 0, revision;
    GLboolean debug = GL_FALSE, forward = GL_FALSE, list = GL_FALSE;
    GLint flags, mask;
    GLFWwindow* window;

    while ((ch = getopt(argc, argv, "a:b:dfhlm:n:p:s:")) != -1)
    {
        switch (ch)
        {
            case 'a':
                if (strcasecmp(optarg, API_OPENGL) == 0)
                    api = GLFW_OPENGL_API;
                else if (strcasecmp(optarg, API_OPENGL_ES) == 0)
                    api = GLFW_OPENGL_ES_API;
                else
                {
                    usage();
                    exit(EXIT_FAILURE);
                }
                break;
            case 'b':
                if (strcasecmp(optarg, BEHAVIOR_NAME_NONE) == 0)
                    behavior = GLFW_RELEASE_BEHAVIOR_NONE;
                else if (strcasecmp(optarg, BEHAVIOR_NAME_FLUSH) == 0)
                    behavior = GLFW_RELEASE_BEHAVIOR_FLUSH;
                else
                {
                    usage();
                    exit(EXIT_FAILURE);
                }
                break;
            case 'd':
                debug = GL_TRUE;
                break;
            case 'f':
                forward = GL_TRUE;
                break;
            case 'h':
                usage();
                exit(EXIT_SUCCESS);
            case 'l':
                list = GL_TRUE;
                break;
            case 'm':
                major = atoi(optarg);
                break;
            case 'n':
                minor = atoi(optarg);
                break;
            case 'p':
                if (strcasecmp(optarg, PROFILE_NAME_CORE) == 0)
                    profile = GLFW_OPENGL_CORE_PROFILE;
                else if (strcasecmp(optarg, PROFILE_NAME_COMPAT) == 0)
                    profile = GLFW_OPENGL_COMPAT_PROFILE;
                else
                {
                    usage();
                    exit(EXIT_FAILURE);
                }
                break;
            case 's':
                if (strcasecmp(optarg, STRATEGY_NAME_NONE) == 0)
                    strategy = GLFW_NO_RESET_NOTIFICATION;
                else if (strcasecmp(optarg, STRATEGY_NAME_LOSE) == 0)
                    strategy = GLFW_LOSE_CONTEXT_ON_RESET;
                else
                {
                    usage();
                    exit(EXIT_FAILURE);
                }
                break;
            default:
                usage();
                exit(EXIT_FAILURE);
        }
    }

    // Initialize GLFW and create window

    if (!valid_version())
        exit(EXIT_FAILURE);

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    if (major != 1 || minor != 0)
    {
        glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, major);
        glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, minor);
    }

    if (api != 0)
        glfwWindowHint(GLFW_CLIENT_API, api);

    if (debug)
        glfwWindowHint(GLFW_OPENGL_DEBUG_CONTEXT, GL_TRUE);

    if (forward)
        glfwWindowHint(GLFW_OPENGL_FORWARD_COMPAT, GL_TRUE);

    if (profile != 0)
        glfwWindowHint(GLFW_OPENGL_PROFILE, profile);

    if (strategy)
        glfwWindowHint(GLFW_CONTEXT_ROBUSTNESS, strategy);

    if (behavior)
        glfwWindowHint(GLFW_CONTEXT_RELEASE_BEHAVIOR, behavior);

    glfwWindowHint(GLFW_RED_BITS, GLFW_DONT_CARE);
    glfwWindowHint(GLFW_GREEN_BITS, GLFW_DONT_CARE);
    glfwWindowHint(GLFW_BLUE_BITS, GLFW_DONT_CARE);
    glfwWindowHint(GLFW_ALPHA_BITS, GLFW_DONT_CARE);
    glfwWindowHint(GLFW_DEPTH_BITS, GLFW_DONT_CARE);
    glfwWindowHint(GLFW_STENCIL_BITS, GLFW_DONT_CARE);
    glfwWindowHint(GLFW_ACCUM_RED_BITS, GLFW_DONT_CARE);
    glfwWindowHint(GLFW_ACCUM_GREEN_BITS, GLFW_DONT_CARE);
    glfwWindowHint(GLFW_ACCUM_BLUE_BITS, GLFW_DONT_CARE);
    glfwWindowHint(GLFW_ACCUM_ALPHA_BITS, GLFW_DONT_CARE);
    glfwWindowHint(GLFW_AUX_BUFFERS, GLFW_DONT_CARE);
    glfwWindowHint(GLFW_SAMPLES, GLFW_DONT_CARE);
    glfwWindowHint(GLFW_SRGB_CAPABLE, GLFW_DONT_CARE);

    glfwWindowHint(GLFW_VISIBLE, GL_FALSE);

    window = glfwCreateWindow(200, 200, "Version", NULL, NULL);
    if (!window)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    glfwMakeContextCurrent(window);

    // Report client API version

    api = glfwGetWindowAttrib(window, GLFW_CLIENT_API);
    major = glfwGetWindowAttrib(window, GLFW_CONTEXT_VERSION_MAJOR);
    minor = glfwGetWindowAttrib(window, GLFW_CONTEXT_VERSION_MINOR);
    revision = glfwGetWindowAttrib(window, GLFW_CONTEXT_REVISION);

    printf("%s context version string: \"%s\"\n",
           get_client_api_name(api),
           glGetString(GL_VERSION));

    printf("%s context version parsed by GLFW: %u.%u.%u\n",
           get_client_api_name(api),
           major, minor, revision);

    // Report client API context properties

    if (api == GLFW_OPENGL_API)
    {
        if (major >= 3)
        {
            glGetIntegerv(GL_CONTEXT_FLAGS, &flags);
            printf("%s context flags (0x%08x):", get_client_api_name(api), flags);

            if (flags & GL_CONTEXT_FLAG_FORWARD_COMPATIBLE_BIT)
                printf(" forward-compatible");
            if (flags & GL_CONTEXT_FLAG_DEBUG_BIT)
                printf(" debug");
            if (flags & GL_CONTEXT_FLAG_ROBUST_ACCESS_BIT_ARB)
                printf(" robustness");
            putchar('\n');

            printf("%s context flags parsed by GLFW:", get_client_api_name(api));

            if (glfwGetWindowAttrib(window, GLFW_OPENGL_FORWARD_COMPAT))
                printf(" forward-compatible");
            if (glfwGetWindowAttrib(window, GLFW_OPENGL_DEBUG_CONTEXT))
                printf(" debug");
            if (glfwGetWindowAttrib(window, GLFW_CONTEXT_ROBUSTNESS) != GLFW_NO_ROBUSTNESS)
                printf(" robustness");
            putchar('\n');
        }

        if (major > 3 || (major == 3 && minor >= 2))
        {
            int profile = glfwGetWindowAttrib(window, GLFW_OPENGL_PROFILE);

            glGetIntegerv(GL_CONTEXT_PROFILE_MASK, &mask);
            printf("%s profile mask (0x%08x): %s\n",
                   get_client_api_name(api),
                   mask,
                   get_profile_name_gl(mask));

            printf("%s profile mask parsed by GLFW: %s\n",
                   get_client_api_name(api),
                   get_profile_name_glfw(profile));
        }

        if (glfwExtensionSupported("GL_ARB_robustness"))
        {
            int robustness;
            GLint strategy;
            glGetIntegerv(GL_RESET_NOTIFICATION_STRATEGY_ARB, &strategy);

            printf("%s robustness strategy (0x%08x): %s\n",
                   get_client_api_name(api),
                   strategy,
                   get_strategy_name_gl(strategy));

            robustness = glfwGetWindowAttrib(window, GLFW_CONTEXT_ROBUSTNESS);

            printf("%s robustness strategy parsed by GLFW: %s\n",
                   get_client_api_name(api),
                   get_strategy_name_glfw(robustness));
        }
    }

    printf("%s context renderer string: \"%s\"\n",
           get_client_api_name(api),
           glGetString(GL_RENDERER));
    printf("%s context vendor string: \"%s\"\n",
           get_client_api_name(api),
           glGetString(GL_VENDOR));

    if (major > 1)
    {
        printf("%s context shading language version: \"%s\"\n",
               get_client_api_name(api),
               glGetString(GL_SHADING_LANGUAGE_VERSION));
    }

    // Report client API extensions
    if (list)
        list_extensions(api, major, minor);

    glfwTerminate();
    exit(EXIT_SUCCESS);
}